

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::OpenFile
          (BamStandardIndex *this,string *filename,OpenMode mode)

{
  int iVar1;
  IBamIODevice *pIVar2;
  BamException *pBVar3;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string message;
  
  CloseFile(this);
  pIVar2 = BamDeviceFactory::CreateDevice(filename);
  (this->m_resources).Device = pIVar2;
  if (pIVar2 == (IBamIODevice *)0x0) {
    std::__cxx11::string::string((string *)&local_58,"could not open file: ",&local_59);
    std::operator+(&message,&local_58,filename);
    std::__cxx11::string::~string((string *)&local_58);
    pBVar3 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_58,"BamStandardIndex::OpenFile",&local_59);
    BamException::BamException(pBVar3,&local_58,&message);
    __cxa_throw(pBVar3,&BamException::typeinfo,BamException::~BamException);
  }
  (*pIVar2->_vptr_IBamIODevice[4])(pIVar2,(ulong)mode);
  pIVar2 = (this->m_resources).Device;
  if (pIVar2 != (IBamIODevice *)0x0) {
    iVar1 = (*pIVar2->_vptr_IBamIODevice[10])();
    if ((char)iVar1 != '\0') {
      return;
    }
  }
  std::__cxx11::string::string((string *)&local_58,"could not open file: ",&local_59);
  std::operator+(&message,&local_58,filename);
  std::__cxx11::string::~string((string *)&local_58);
  pBVar3 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_58,"BamStandardIndex::OpenFile",&local_59);
  BamException::BamException(pBVar3,&local_58,&message);
  __cxa_throw(pBVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::OpenFile(const std::string& filename, IBamIODevice::OpenMode mode)
{

    // make sure any previous index file is closed
    CloseFile();

    m_resources.Device = BamDeviceFactory::CreateDevice(filename);
    if (m_resources.Device == 0) {
        const std::string message = std::string("could not open file: ") + filename;
        throw BamException("BamStandardIndex::OpenFile", message);
    }

    // attempt to open file
    m_resources.Device->Open(mode);
    if (!IsDeviceOpen()) {
        const std::string message = std::string("could not open file: ") + filename;
        throw BamException("BamStandardIndex::OpenFile", message);
    }
}